

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membervariable.cpp
# Opt level: O0

void __thiscall
cppgenerate::MemberVariable::MemberVariable(MemberVariable *this,MemberVariable *other)

{
  MemberVariable *other_local;
  MemberVariable *this_local;
  
  Variable::Variable(&this->super_Variable,&other->super_Variable);
  (this->super_Variable)._vptr_Variable = (_func_int **)&PTR__MemberVariable_0014ad80;
  std::__cxx11::string::string((string *)&this->m_changedSignalName);
  this->m_access = other->m_access;
  this->m_generateGetter = (bool)(other->m_generateGetter & 1);
  this->m_generateSetter = (bool)(other->m_generateSetter & 1);
  this->m_isQProperty = (bool)(other->m_isQProperty & 1);
  return;
}

Assistant:

MemberVariable::MemberVariable( const MemberVariable& other ) :
    Variable( other ) {
    m_access = other.m_access;
    m_generateGetter = other.m_generateGetter;
    m_generateSetter = other.m_generateSetter;
    m_isQProperty = other.m_isQProperty;
}